

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_constructor.c
# Opt level: O2

int constructor_compare(constructor ctor,type_id *args,size_t size)

{
  int iVar1;
  type_id tVar2;
  ulong uVar3;
  type_conflict t;
  size_t *psVar4;
  
  if ((ctor != (constructor)0x0) && (ctor->count == size)) {
    psVar4 = &ctor[1].count;
    uVar3 = 0;
    do {
      if (size == uVar3) {
        return 0;
      }
      if (uVar3 < ctor->count) {
        t = (type_conflict)*psVar4;
      }
      else {
        t = (type_conflict)0x0;
      }
      iVar1 = args[uVar3];
      tVar2 = type_index(t);
      uVar3 = uVar3 + 1;
      psVar4 = psVar4 + 3;
    } while (iVar1 == tVar2);
  }
  return 1;
}

Assistant:

int constructor_compare(constructor ctor, type_id args[], size_t size)
{
	size_t iterator;

	if (ctor == NULL)
	{
		return 1;
	}

	if (ctor->count != size)
	{
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		type t = constructor_get_type(ctor, iterator);

		if (args[iterator] != type_index(t))
		{
			return 1;
		}
	}

	return 0;
}